

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadTimingSense(Scl_Tree_t *p,Scl_Item_t *pPin)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Scl_Item_t *pSVar6;
  bool bVar7;
  
  uVar1 = pPin->Child;
  iVar4 = p->nItems;
  if ((int)uVar1 < iVar4) {
    if ((int)uVar1 < 0) {
      pSVar6 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar6 = p->pItems + uVar1;
    }
    if (pSVar6 != (Scl_Item_t *)0x0) {
      pcVar5 = p->pContents;
      do {
        iVar3 = (pSVar6->Key).Beg;
        iVar2 = (pSVar6->Key).End - iVar3;
        iVar3 = strncmp(pcVar5 + iVar3,"timing_sense",(long)iVar2);
        if (iVar2 == 0xc && iVar3 == 0) {
          pcVar5 = Scl_LibertyReadString(p,pSVar6->Head);
          iVar4 = strcmp(pcVar5,"positive_unate");
          if (iVar4 == 0) {
            iVar4 = 1;
          }
          else {
            iVar4 = strcmp(pcVar5,"negative_unate");
            if (iVar4 != 0) {
              iVar4 = strcmp(pcVar5,"non_unate");
              bVar7 = iVar4 != 0;
              iVar4 = 3;
              goto LAB_004659b4;
            }
            iVar4 = 2;
          }
          bVar7 = false;
LAB_004659b4:
          if (bVar7) {
            return 3;
          }
          return iVar4;
        }
        uVar1 = pSVar6->Next;
        if (iVar4 <= (int)uVar1) goto LAB_004659cc;
        if ((int)uVar1 < 0) {
          pSVar6 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar6 = p->pItems + uVar1;
        }
      } while (pSVar6 != (Scl_Item_t *)0x0);
    }
    return 3;
  }
LAB_004659cc:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadTimingSense( Scl_Tree_t * p, Scl_Item_t * pPin )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, pPin, pItem, "timing_sense" )
    {
        char * pToken = Scl_LibertyReadString(p, pItem->Head);
        if ( !strcmp(pToken, "positive_unate") )
            return sc_ts_Pos;
        if ( !strcmp(pToken, "negative_unate") )
            return sc_ts_Neg;
        if ( !strcmp(pToken, "non_unate") )
            return sc_ts_Non;
        break;
    }
    return sc_ts_Non;
}